

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

Code * __thiscall r_exec::PGMOverlay::get_mk_rdx(PGMOverlay *this,uint16_t *extent_index)

{
  int iVar1;
  Code *pCVar2;
  _Mem *mem;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Code *pCVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar4;
  size_type sVar5;
  undefined4 extraout_var_03;
  const_reference this_00;
  View *pVVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Atom local_54 [4];
  Atom local_50 [4];
  Atom local_4c [6];
  ushort local_46;
  Atom local_44 [4];
  Atom local_40 [2];
  uint16_t i;
  Atom local_3c [4];
  Atom local_38 [16];
  Code *local_28;
  Code *mk_rdx;
  uint16_t *puStack_18;
  uint16_t write_index;
  uint16_t *extent_index_local;
  PGMOverlay *this_local;
  
  mk_rdx._6_2_ = 0;
  *extent_index = 5;
  puStack_18 = extent_index;
  extent_index_local = (uint16_t *)this;
  pCVar2 = (Code *)operator_new(0x150);
  mem = _Mem::Get();
  LObject::LObject((LObject *)pCVar2,&mem->super_Mem);
  local_28 = pCVar2;
  r_code::Atom::Marker((ushort)local_38,(uchar)Opcodes::MkRdx);
  mk_rdx._6_2_ = mk_rdx._6_2_ + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_38);
  r_code::Atom::~Atom(local_38);
  r_code::Atom::RPointer((ushort)local_3c);
  mk_rdx._6_2_ = mk_rdx._6_2_ + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_3c);
  r_code::Atom::~Atom(local_3c);
  pCVar2 = local_28;
  pCVar3 = Overlay::getObject((Overlay *)this);
  (*(((Object<r_code::LObject,_r_exec::LObject> *)&pCVar2->super__Object)->super_LObject).super_Code
    .super__Object._vptr__Object[0x19])(pCVar2,pCVar3);
  r_code::Atom::IPointer((ushort)local_40);
  mk_rdx._6_2_ = mk_rdx._6_2_ + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_40);
  r_code::Atom::~Atom(local_40);
  std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::size
            (&this->input_views);
  r_code::Atom::Set((uchar)local_44);
  *puStack_18 = *puStack_18 + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_44);
  r_code::Atom::~Atom(local_44);
  local_46 = 0;
  while( true ) {
    uVar4 = (ulong)local_46;
    sVar5 = std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::size
                      (&this->input_views);
    if (sVar5 <= uVar4) break;
    r_code::Atom::RPointer((ushort)local_4c);
    *puStack_18 = *puStack_18 + 1;
    iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject
              ).super_Code.super__Object._vptr__Object[4])();
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_4c);
    r_code::Atom::~Atom(local_4c);
    pCVar2 = local_28;
    this_00 = std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::
              operator[](&this->input_views,(ulong)local_46);
    pVVar6 = core::P<r_code::View>::operator->(this_00);
    pCVar3 = core::P::operator_cast_to_Code_((P *)&pVVar6->object);
    (*(((Object<r_code::LObject,_r_exec::LObject> *)&pCVar2->super__Object)->super_LObject).
      super_Code.super__Object._vptr__Object[0x19])(pCVar2,pCVar3);
    local_46 = local_46 + 1;
  }
  r_code::Atom::IPointer((ushort)local_50);
  mk_rdx._6_2_ = mk_rdx._6_2_ + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_50);
  r_code::Atom::~Atom(local_50);
  r_code::Atom::Float(1.0);
  mk_rdx._6_2_ = mk_rdx._6_2_ + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&local_28->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])();
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),local_54);
  r_code::Atom::~Atom(local_54);
  return local_28;
}

Assistant:

Code *PGMOverlay::get_mk_rdx(uint16_t &extent_index) const
{
    uint16_t write_index = 0;
    extent_index = MK_RDX_ARITY + 1;
    Code *mk_rdx = new r_exec::LObject(_Mem::Get());
    mk_rdx->code(write_index++) = Atom::Marker(Opcodes::MkRdx, MK_RDX_ARITY);
    mk_rdx->code(write_index++) = Atom::RPointer(0); // code.
    mk_rdx->add_reference(getObject());
    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // inputs.
    mk_rdx->code(extent_index++) = Atom::Set(input_views.size());

    for (uint16_t i = 0; i < input_views.size(); ++i) {
        mk_rdx->code(extent_index++) = Atom::RPointer(i + 1);
        mk_rdx->add_reference(input_views[i]->object);
    }

    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // productions.
    mk_rdx->code(write_index++) = Atom::Float(1); // psln_thr.
    return mk_rdx;
}